

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<unsigned_char>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  byte bVar1;
  uint uVar2;
  PointAttribute *this_00;
  int32_t *piVar3;
  long lVar4;
  uint in_ESI;
  SequentialAttributeDecoder *in_RDI;
  uchar value;
  int c;
  uint32_t i;
  int out_byte_pos;
  int val_id;
  int32_t *portable_attribute_data;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> att_val;
  int entry_size;
  int num_components;
  DataBuffer *in_stack_ffffffffffffff88;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  uchar in_stack_ffffffffffffff9f;
  DataBuffer *in_stack_ffffffffffffffa0;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  
  this_00 = SequentialAttributeDecoder::attribute(in_RDI);
  bVar1 = GeometryAttribute::num_components(&this_00->super_GeometryAttribute);
  uVar2 = (uint)bVar1;
  operator_new__((long)(int)uVar2);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            (in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88);
  piVar3 = GetPortableAttributeData
                     ((SequentialIntegerAttributeDecoder *)
                      CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  local_38 = 0;
  local_3c = 0;
  for (local_40 = 0; local_40 < in_ESI; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < (int)uVar2; local_44 = local_44 + 1) {
      lVar4 = (long)local_38;
      local_38 = local_38 + 1;
      in_stack_ffffffffffffff9f = (uchar)piVar3[lVar4];
      in_stack_ffffffffffffffa0 =
           (DataBuffer *)
           std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                     (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      *(uchar *)&(in_stack_ffffffffffffffa0->data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = in_stack_ffffffffffffff9f;
    }
    SequentialAttributeDecoder::attribute(in_RDI);
    in_stack_ffffffffffffff88 = PointAttribute::buffer((PointAttribute *)0x20ae88);
    in_stack_ffffffffffffff90 =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)(long)local_3c;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
              (in_stack_ffffffffffffff90);
    DataBuffer::Write(in_stack_ffffffffffffffa0,
                      CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    local_3c = uVar2 + local_3c;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffff90);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}